

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * Catch::Detail::rawMemoryToString_abi_cxx11_(void *object,size_t size)

{
  Arch AVar1;
  ReusableStringStream *this;
  ReusableStringStream *this_00;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  ReusableStringStream rss;
  uchar *bytes;
  int inc;
  int end;
  int i;
  ReusableStringStream *in_stack_ffffffffffffff58;
  ReusableStringStream *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ReusableStringStream *in_stack_ffffffffffffff70;
  string *this_01;
  uint in_stack_ffffffffffffffa0;
  _Setw in_stack_ffffffffffffffa4;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_1c = 0;
  local_24 = 1;
  this_01 = in_RDI;
  AVar1 = anon_unknown_0::Endianness::which();
  local_20 = in_EDX;
  if (AVar1 == Little) {
    local_1c = in_EDX + -1;
    local_24 = -1;
    local_20 = -1;
  }
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)this_01);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff60,(char (*) [3])in_stack_ffffffffffffff58);
  clara::std::setfill<char>('0');
  this = ReusableStringStream::operator<<
                   (in_stack_ffffffffffffff70,
                    (_Setfill<char> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
  ;
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff60,(_func_ios_base_ptr_ios_base_ptr *)in_stack_ffffffffffffff58)
  ;
  for (; local_1c != local_20; local_1c = local_24 + local_1c) {
    in_stack_ffffffffffffffa4 = clara::std::setw(2);
    this_00 = ReusableStringStream::operator<<
                        (this,(_Setw *)CONCAT44(in_stack_ffffffffffffffa4._M_n,
                                                in_stack_ffffffffffffff68));
    in_stack_ffffffffffffffa0 = (uint)*(byte *)(in_RSI + local_1c);
    ReusableStringStream::operator<<(this_00,(uint *)in_stack_ffffffffffffff58);
  }
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff58);
  ReusableStringStream::~ReusableStringStream
            ((ReusableStringStream *)
             CONCAT44(in_stack_ffffffffffffffa4._M_n,in_stack_ffffffffffffffa0));
  return in_RDI;
}

Assistant:

std::string rawMemoryToString( const void *object, std::size_t size ) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>( size ), inc = 1;
        if( Endianness::which() == Endianness::Little ) {
            i = end-1;
            end = inc = -1;
        }

        unsigned char const *bytes = static_cast<unsigned char const *>(object);
        ReusableStringStream rss;
        rss << "0x" << std::setfill('0') << std::hex;
        for( ; i != end; i += inc )
             rss << std::setw(2) << static_cast<unsigned>(bytes[i]);
       return rss.str();
    }